

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void Util::writeXmlElement<HorizontalAlignment>
               (stringstream *str,int indent,string *name,HorizontalAlignment value)

{
  ostream *poVar1;
  Util local_48 [36];
  HorizontalAlignment local_24;
  string *psStack_20;
  HorizontalAlignment value_local;
  string *name_local;
  stringstream *psStack_10;
  int indent_local;
  stringstream *str_local;
  
  local_24 = value;
  psStack_20 = name;
  name_local._4_4_ = indent;
  psStack_10 = str;
  getIndent_abi_cxx11_(local_48,indent);
  poVar1 = std::operator<<((ostream *)(str + 0x10),(string *)local_48);
  poVar1 = std::operator<<(poVar1,"<");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,">");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
  poVar1 = std::operator<<(poVar1,"</");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,">");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

static void writeXmlElement(std::stringstream &str, int indent, std::string name, T value)
	{
		str << getIndent(indent) << "<" << name << ">" << value << "</" << name << ">" << std::endl;
	}